

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_compact.hpp
# Opt level: O1

void __thiscall
Catch::CompactReporter::AssertionPrinter::printResultType
          (AssertionPrinter *this,Code colour,string *passOrFail)

{
  ostream *poVar1;
  Colour colourGuard;
  
  if (passOrFail->_M_string_length != 0) {
    Colour::use(colour);
    poVar1 = this->stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(passOrFail->_M_dataplus)._M_p,passOrFail->_M_string_length);
    Colour::use(None);
    std::__ostream_insert<char,std::char_traits<char>>(this->stream,":",1);
    return;
  }
  return;
}

Assistant:

void printResultType( Colour::Code colour, std::string passOrFail ) const {
                if( !passOrFail.empty() ) {
                    {
                        Colour colourGuard( colour );
                        stream << " " << passOrFail;
                    }
                    stream << ":";
                }
            }